

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::XMLScanner::scanEq(XMLScanner *this,bool inDecl)

{
  bool bVar1;
  bool local_1a;
  byte local_19;
  bool skippedSomething;
  XMLScanner *pXStack_18;
  bool inDecl_local;
  XMLScanner *this_local;
  
  local_19 = inDecl;
  pXStack_18 = this;
  if (inDecl) {
    ReaderMgr::skipPastSpaces(&this->fReaderMgr,&local_1a,inDecl);
    bVar1 = ReaderMgr::skippedChar(&this->fReaderMgr,L'=');
    if (bVar1) {
      ReaderMgr::skipPastSpaces(&this->fReaderMgr,&local_1a,(bool)(local_19 & 1));
      return true;
    }
  }
  else {
    ReaderMgr::skipPastSpaces(&this->fReaderMgr);
    bVar1 = ReaderMgr::skippedChar(&this->fReaderMgr,L'=');
    if (bVar1) {
      ReaderMgr::skipPastSpaces(&this->fReaderMgr);
      return true;
    }
  }
  return false;
}

Assistant:

bool XMLScanner::scanEq(bool inDecl)
{
    if(inDecl)
    {
        bool skippedSomething;
        fReaderMgr.skipPastSpaces(skippedSomething, inDecl);
        if (fReaderMgr.skippedChar(chEqual))
        {
            fReaderMgr.skipPastSpaces(skippedSomething, inDecl);
            return true;
        }
    }
    else
    {
        fReaderMgr.skipPastSpaces();
        if (fReaderMgr.skippedChar(chEqual))
        {
            fReaderMgr.skipPastSpaces();
            return true;
        }
    }
    return false;
}